

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolDHCP.cpp
# Opt level: O0

void __thiscall
ProtocolDHCP::SendRequest
          (ProtocolDHCP *this,uint8_t messageType,uint8_t *serverAddress,uint8_t *requestAddress)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  DataBuffer *buffer_00;
  uint64_t uVar4;
  size_t sVar5;
  undefined4 extraout_var;
  uint8_t local_40 [8];
  uint8_t targetIP [4];
  uint8_t sourceIP [4];
  int pad;
  int i;
  DataBuffer *buffer;
  uint8_t *requestAddress_local;
  uint8_t *serverAddress_local;
  uint8_t messageType_local;
  ProtocolDHCP *this_local;
  
  buffer_00 = ProtocolUDP::GetTxBuffer(this->UDP,this->MAC);
  if (buffer_00 != (DataBuffer *)0x0) {
    uVar4 = osTime::GetTime();
    this->PendingXID = (int)uVar4;
    sVar5 = Pack8(buffer_00->Packet,(ulong)buffer_00->Length,'\x01');
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack8(buffer_00->Packet,(ulong)buffer_00->Length,'\x01');
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack8(buffer_00->Packet,(ulong)buffer_00->Length,'\x06');
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack8(buffer_00->Packet,(ulong)buffer_00->Length,'\0');
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack32(buffer_00->Packet,(ulong)buffer_00->Length,this->PendingXID);
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack16(buffer_00->Packet,(ulong)buffer_00->Length,0);
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack16(buffer_00->Packet,(ulong)buffer_00->Length,0x8000);
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack32(buffer_00->Packet,(ulong)buffer_00->Length,0);
    buffer_00->Length = (uint16_t)sVar5;
    sVar5 = Pack32(buffer_00->Packet,(ulong)buffer_00->Length,0);
    buffer_00->Length = (uint16_t)sVar5;
    if (serverAddress == (uint8_t *)0x0) {
      sVar5 = Pack32(buffer_00->Packet,(ulong)buffer_00->Length,0);
      buffer_00->Length = (uint16_t)sVar5;
    }
    else {
      sourceIP[0] = '\0';
      sourceIP[1] = '\0';
      sourceIP[2] = '\0';
      sourceIP[3] = '\0';
      for (; (int)sourceIP < 4; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
        uVar1 = serverAddress[(int)sourceIP];
        uVar2 = buffer_00->Length;
        buffer_00->Length = uVar2 + 1;
        buffer_00->Packet[uVar2] = uVar1;
      }
    }
    sVar5 = Pack32(buffer_00->Packet,(ulong)buffer_00->Length,0);
    buffer_00->Length = (uint16_t)sVar5;
    sourceIP[0] = '\0';
    sourceIP[1] = '\0';
    sourceIP[2] = '\0';
    sourceIP[3] = '\0';
    for (; (int)sourceIP < 6; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
      iVar3 = (*this->MAC->_vptr_InterfaceMAC[5])();
      uVar1 = *(uint8_t *)(CONCAT44(extraout_var,iVar3) + (long)(int)sourceIP);
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = uVar1;
    }
    for (; (int)sourceIP < 0x10; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '\0';
    }
    sourceIP[0] = '\0';
    sourceIP[1] = '\0';
    sourceIP[2] = '\0';
    sourceIP[3] = '\0';
    for (; (int)sourceIP < 0x40; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '\0';
    }
    sourceIP[0] = '\0';
    sourceIP[1] = '\0';
    sourceIP[2] = '\0';
    sourceIP[3] = '\0';
    for (; (int)sourceIP < 0x80; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '\0';
    }
    sVar5 = Pack32(buffer_00->Packet,(ulong)buffer_00->Length,0x63825363);
    buffer_00->Length = (uint16_t)sVar5;
    uVar2 = buffer_00->Length;
    buffer_00->Length = uVar2 + 1;
    buffer_00->Packet[uVar2] = '5';
    uVar2 = buffer_00->Length;
    buffer_00->Length = uVar2 + 1;
    buffer_00->Packet[uVar2] = '\x01';
    uVar2 = buffer_00->Length;
    buffer_00->Length = uVar2 + 1;
    buffer_00->Packet[uVar2] = messageType;
    if (requestAddress != (uint8_t *)0x0) {
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '2';
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '\x04';
      sourceIP[0] = '\0';
      sourceIP[1] = '\0';
      sourceIP[2] = '\0';
      sourceIP[3] = '\0';
      for (; (int)sourceIP < 4; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
        uVar1 = requestAddress[(int)sourceIP];
        uVar2 = buffer_00->Length;
        buffer_00->Length = uVar2 + 1;
        buffer_00->Packet[uVar2] = uVar1;
      }
    }
    if (serverAddress != (uint8_t *)0x0) {
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '6';
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '\x05';
      sourceIP[0] = '\0';
      sourceIP[1] = '\0';
      sourceIP[2] = '\0';
      sourceIP[3] = '\0';
      for (; (int)sourceIP < 4; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
        uVar1 = serverAddress[(int)sourceIP];
        uVar2 = buffer_00->Length;
        buffer_00->Length = uVar2 + 1;
        buffer_00->Packet[uVar2] = uVar1;
      }
    }
    uVar2 = buffer_00->Length;
    buffer_00->Length = uVar2 + 1;
    buffer_00->Packet[uVar2] = 0xff;
    targetIP[0] = '\b';
    targetIP[1] = '\0';
    targetIP[2] = '\0';
    targetIP[3] = '\0';
    sourceIP[0] = '\0';
    sourceIP[1] = '\0';
    sourceIP[2] = '\0';
    sourceIP[3] = '\0';
    for (; (int)sourceIP < 8; sourceIP = (uint8_t  [4])((int)sourceIP + 1)) {
      uVar2 = buffer_00->Length;
      buffer_00->Length = uVar2 + 1;
      buffer_00->Packet[uVar2] = '\0';
    }
    memset(local_40 + 4,0,4);
    local_40[0] = 0xff;
    local_40[1] = 0xff;
    local_40[2] = 0xff;
    local_40[3] = 0xff;
    ProtocolUDP::Transmit(this->UDP,buffer_00,local_40,0x43,local_40 + 4,0x44);
  }
  return;
}

Assistant:

void ProtocolDHCP::SendRequest(uint8_t messageType,
                               const uint8_t* serverAddress,
                               const uint8_t* requestAddress)
{
    DataBuffer* buffer = UDP.GetTxBuffer(&MAC);
    int i;

    if (buffer)
    {
        PendingXID = (uint32_t)osTime::GetTime();

        buffer->Length = Pack8(buffer->Packet, buffer->Length, 1);           // op
        buffer->Length = Pack8(buffer->Packet, buffer->Length, 1);           // htype
        buffer->Length = Pack8(buffer->Packet, buffer->Length, 6);           // hlen
        buffer->Length = Pack8(buffer->Packet, buffer->Length, 0);           // hops
        buffer->Length = Pack32(buffer->Packet, buffer->Length, PendingXID); // xid
        buffer->Length = Pack16(buffer->Packet, buffer->Length, 0);          // secs
        buffer->Length = Pack16(buffer->Packet, buffer->Length, 0x8000);     // flags
        buffer->Length = Pack32(buffer->Packet, buffer->Length, 0);          // (Client IP address)
        buffer->Length = Pack32(buffer->Packet, buffer->Length, 0);          // (Your IP address)
        if (serverAddress != nullptr)
        {
            for (i = 0; i < 4; i++)
            {
                buffer->Packet[buffer->Length++] = serverAddress[i]; // (Server IP address)
            }
        }
        else
        {
            buffer->Length = Pack32(buffer->Packet, buffer->Length, 0); // (Your IP address)
        }
        buffer->Length = Pack32(buffer->Packet, buffer->Length, 0); // (Gateway IP address)
        for (i = 0; i < 6; i++)
        {
            buffer->Packet[buffer->Length++] = MAC.GetUnicastAddress()[i];
        }
        for (; i < 16; i++)
        {
            buffer->Packet[buffer->Length++] = 0; // pad chaddr to 16 bytes
        }
        for (i = 0; i < 64; i++)
        {
            buffer->Packet[buffer->Length++] = 0; // sname
        }
        for (i = 0; i < 128; i++)
        {
            buffer->Packet[buffer->Length++] = 0; // file
        }
        buffer->Length = Pack32(buffer->Packet, buffer->Length, DHCP_MAGIC);

        // Add options
        // 1     DHCPDISCOVER
        // 2     DHCPOFFER
        // 3     DHCPREQUEST
        // 4     DHCPDECLINE
        // 5     DHCPACK
        // 6     DHCPNAK
        // 7     DHCPRELEASE
        buffer->Packet[buffer->Length++] = 53;
        buffer->Packet[buffer->Length++] = 1;
        buffer->Packet[buffer->Length++] = messageType;

        if (requestAddress != nullptr)
        {
            buffer->Packet[buffer->Length++] = 50;
            buffer->Packet[buffer->Length++] = 4; // length
            for (i = 0; i < 4; i++)
            {
                buffer->Packet[buffer->Length++] = requestAddress[i];
            }
        }

        if (serverAddress != nullptr)
        {
            // server address
            buffer->Packet[buffer->Length++] = 54;
            buffer->Packet[buffer->Length++] = 5; // length
            for (i = 0; i < 4; i++)
            {
                buffer->Packet[buffer->Length++] = serverAddress[i]; // (Server IP address)
            }
        }

        buffer->Packet[buffer->Length++] = 255; // End options

        int pad = 8;
        for (i = 0; i < pad; i++)
        {
            buffer->Packet[buffer->Length++] = 0;
        }

        uint8_t sourceIP[] = {0, 0, 0, 0};
        uint8_t targetIP[] = {255, 255, 255, 255};
        UDP.Transmit(buffer, targetIP, 67, sourceIP, 68);
    }
}